

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# learner.h
# Opt level: O0

learner<ftrl,_example> *
LEARNER::init_learner<ftrl,example,LEARNER::learner<char,example>>
          (free_ptr<ftrl> *dat,_func_void_ftrl_ptr_learner<char,_example>_ptr_example_ptr *learn,
          _func_void_ftrl_ptr_learner<char,_example>_ptr_example_ptr *predict,
          size_t params_per_weight)

{
  learner<ftrl,_example> *plVar1;
  unique_ptr<ftrl,_void_(*)(void_*)> *in_RCX;
  _func_void_ftrl_ptr_learner<char,_example>_ptr_example_ptr *in_RDX;
  _func_void_ftrl_ptr_learner<char,_example>_ptr_example_ptr *in_RSI;
  learner<char,_example> *in_RDI;
  learner<ftrl,_example> *ret;
  undefined8 in_stack_ffffffffffffffd8;
  prediction_type_t pred_type;
  
  pred_type = (prediction_type_t)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
  std::unique_ptr<ftrl,_void_(*)(void_*)>::get(in_RCX);
  plVar1 = learner<ftrl,example>::init_learner<LEARNER::learner<char,example>>
                     ((ftrl *)ret,in_RDI,in_RSI,in_RDX,(size_t)in_RCX,pred_type);
  std::unique_ptr<ftrl,_void_(*)(void_*)>::release((unique_ptr<ftrl,_void_(*)(void_*)> *)0x2d4ace);
  return plVar1;
}

Assistant:

learner<T, E>& init_learner(
    free_ptr<T>& dat, void (*learn)(T&, L&, E&), void (*predict)(T&, L&, E&), size_t params_per_weight)
{
  auto ret =
      &learner<T, E>::init_learner(dat.get(), (L*)nullptr, learn, predict, params_per_weight, prediction_type::scalar);

  dat.release();
  return *ret;
}